

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O2

qreal QHighDpiScaling::screenSubfactor(QPlatformScreen *screen)

{
  Span *pSVar1;
  QScreen *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  const_iterator cVar5;
  bool screenPropertyUsed;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (screen == (QPlatformScreen *)0x0) {
    qVar4 = 1.0;
  }
  else {
    if (m_screenFactorSet) {
      pQVar2 = QPlatformScreen::screen(screen);
      if (pQVar2 != (QScreen *)0x0) {
        QObject::property((char *)&local_48);
        ::QVariant::toReal((bool *)&local_48);
        ::QVariant::~QVariant(&local_48);
      }
      (*screen->_vptr_QPlatformScreen[0x12])((QArrayDataPointer<char16_t> *)&local_48,screen);
      cVar5 = QHash<QString,_double>::constFindImpl<QString>
                        (&m_namedScreenScaleFactors,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      if (cVar5.i.d != (Data<QHashPrivate::Node<QString,_double>_> *)0x0 || cVar5.i.bucket != 0) {
        pSVar1 = (cVar5.i.d)->spans;
        uVar3 = cVar5.i.bucket >> 7;
        qVar4 = *(qreal *)(pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar5.i.bucket & 0x7f]]
                           .storage.data + 0x18);
        goto LAB_002bc282;
      }
    }
    qVar4 = 1.0;
    if (m_usePlatformPluginDpi == true) {
      qVar4 = rawScaleFactor(screen);
      qVar4 = roundScaleFactor(qVar4);
    }
  }
LAB_002bc282:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return qVar4;
}

Assistant:

qreal QHighDpiScaling::screenSubfactor(const QPlatformScreen *screen)
{
    auto factor = qreal(1.0);
    if (!screen)
        return factor;

    // Unlike the other code where factors are combined by multiplication,
    // factors from QT_SCREEN_SCALE_FACTORS takes precedence over the factor
    // computed from platform plugin DPI. The rationale is that the user is
    // setting the factor to override erroneous DPI values.
    bool screenPropertyUsed = false;
    if (m_screenFactorSet) {
        // Check if there is a factor set on the screen object or associated
        // with the screen name. These are mutually exclusive, so checking
        // order is not significant.
        if (auto qScreen = screen->screen()) {
            auto screenFactor = qScreen->property(scaleFactorProperty).toReal(&screenPropertyUsed);
            if (screenPropertyUsed)
                factor = screenFactor;
        }

        if (!screenPropertyUsed) {
            auto byNameIt = QHighDpiScaling::m_namedScreenScaleFactors.constFind(screen->name());
            if ((screenPropertyUsed = byNameIt != QHighDpiScaling::m_namedScreenScaleFactors.cend()))
                factor = *byNameIt;
        }
    }

    if (!screenPropertyUsed && m_usePlatformPluginDpi)
        factor = roundScaleFactor(rawScaleFactor(screen));

    return factor;
}